

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

pointer __thiscall google::protobuf::RepeatedField<int>::Mutable(RepeatedField<int> *this,int index)

{
  uint uVar1;
  uint extraout_EAX;
  uint extraout_EAX_00;
  uint index_00;
  uint extraout_EAX_01;
  int *piVar2;
  void **ppvVar3;
  RepeatedPtrFieldBase *pRVar4;
  long *plVar5;
  undefined1 auStack_68 [8];
  undefined8 uStack_60;
  undefined1 auStack_50 [8];
  undefined8 uStack_48;
  undefined1 auStack_38 [8];
  code *pcStack_30;
  
  pRVar4 = (RepeatedPtrFieldBase *)(ulong)(uint)index;
  if (index < 0) {
    pcStack_30 = (code *)0x1d6936;
    Mutable();
    uVar1 = extraout_EAX;
  }
  else {
    pcStack_30 = (code *)0x1d6906;
    uVar1 = internal::SooRep::size
                      (&this->soo_rep_,
                       (undefined1  [16])
                       ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                       (undefined1  [16])0x0);
    if (index < (int)uVar1) {
      pcStack_30 = (code *)0x1d691c;
      piVar2 = elements(this,(undefined1  [16])
                             ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                             (undefined1  [16])0x0);
      return piVar2 + (long)pRVar4;
    }
  }
  pcStack_30 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>
  ;
  Mutable();
  if ((int)uVar1 < 0) {
    uVar1 = (uint)auStack_38;
    uStack_48 = 0x1d696f;
    internal::RepeatedPtrFieldBase::
    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>();
    index_00 = extraout_EAX_00;
  }
  else {
    index_00 = pRVar4->current_size_;
    if ((int)uVar1 < (int)index_00) {
      uStack_48 = 0x1d6958;
      ppvVar3 = internal::RepeatedPtrFieldBase::element_at(pRVar4,uVar1);
      return (pointer)*ppvVar3;
    }
  }
  pRVar4 = (RepeatedPtrFieldBase *)(ulong)uVar1;
  uStack_48 = 0x1d697d;
  internal::RepeatedPtrFieldBase::
  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>();
  if ((int)index_00 < 0) {
    index_00 = (uint)auStack_50;
    uStack_60 = 0x1d69a9;
    internal::RepeatedPtrFieldBase::
    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
              ();
    uVar1 = extraout_EAX_01;
  }
  else {
    uVar1 = pRVar4->current_size_;
    if ((int)index_00 < (int)uVar1) {
      uStack_60 = 0x1d6992;
      ppvVar3 = internal::RepeatedPtrFieldBase::element_at(pRVar4,index_00);
      return (pointer)*ppvVar3;
    }
  }
  pRVar4 = (RepeatedPtrFieldBase *)(ulong)index_00;
  uStack_60 = 0x1d69b7;
  internal::RepeatedPtrFieldBase::
  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
            ();
  if ((int)uVar1 < 0) {
    uVar1 = (uint)auStack_68;
    internal::RepeatedPtrFieldBase::
    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
              ();
  }
  else if ((int)uVar1 < pRVar4->current_size_) {
    ppvVar3 = internal::RepeatedPtrFieldBase::element_at(pRVar4,uVar1);
    return (pointer)*ppvVar3;
  }
  plVar5 = (long *)(ulong)uVar1;
  internal::RepeatedPtrFieldBase::
  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>();
  if (*plVar5 == 1) {
    return (pointer)(plVar5 + 2);
  }
  if (*plVar5 == 0) {
    __assert_fail("!kEnabled || cap >= kCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb37,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<int>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<int>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<int>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<int>]"
                 );
  }
  __assert_fail("is_soo()",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xf7c,
                "slot_type *absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<int>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<int>>::soo_slot() [Policy = absl::container_internal::FlatHashSetPolicy<int>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<int>]"
               );
}

Assistant:

inline Element* RepeatedField<Element>::Mutable(int index)
    ABSL_ATTRIBUTE_LIFETIME_BOUND {
  ABSL_DCHECK_GE(index, 0);
  ABSL_DCHECK_LT(index, size());
  return &elements(is_soo())[index];
}